

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_resize_filter_arena(Parser *this,size_t num_characters)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  csubstr cVar8;
  char *pcStack_58;
  size_t local_50;
  char msg [39];
  
  uVar6 = (this->m_filter_arena).len;
  if (uVar6 < num_characters) {
    pcVar5 = (this->m_filter_arena).str;
    if (pcVar5 != (char *)0x0) {
      pcVar7 = pcVar5;
      if (uVar6 == 0) {
        builtin_strncpy(msg,"check failed: (m_filter_arena.len > 0)",0x27);
        if (((byte)s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        p_Var1 = (this->m_stack).m_callbacks.m_error;
        cVar8 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
        local_50 = cVar8.len;
        pcStack_58 = cVar8.str;
        LVar3.super_LineCol.col = 0;
        LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f77) << 0x40,0);
        LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f77) << 0x40,8);
        LVar3.name.str = pcStack_58;
        LVar3.name.len = local_50;
        (*p_Var1)(msg,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
        pcVar7 = (this->m_filter_arena).str;
        uVar6 = (this->m_filter_arena).len;
      }
      (*(this->m_stack).m_callbacks.m_free)(pcVar7,uVar6,(this->m_stack).m_callbacks.m_user_data);
      (this->m_filter_arena).str = (char *)0x0;
    }
    pcVar5 = (char *)(*(this->m_stack).m_callbacks.m_allocate)
                               (num_characters,pcVar5,(this->m_stack).m_callbacks.m_user_data);
    (this->m_filter_arena).str = pcVar5;
    (this->m_filter_arena).len = num_characters;
  }
  return;
}

Assistant:

void Parser::_resize_filter_arena(size_t num_characters)
{
    if(num_characters > m_filter_arena.len)
    {
        _c4dbgpf("resize: sz={}", num_characters);
        char *prev = m_filter_arena.str;
        if(m_filter_arena.str)
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_filter_arena.len > 0);
            _RYML_CB_FREE(m_stack.m_callbacks, m_filter_arena.str, char, m_filter_arena.len);
        }
        m_filter_arena.str = _RYML_CB_ALLOC_HINT(m_stack.m_callbacks, char, num_characters, prev);
        m_filter_arena.len = num_characters;
    }
}